

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

FMfloat_format infer_float_format(char *float_magic,int object_len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [11];
  undefined1 auVar8 [11];
  undefined1 auVar9 [11];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  byte bVar32;
  int object_len_local;
  char *float_magic_local;
  
  if (object_len == 4) {
    if (*(uchar (*) [4])float_magic == IEEE_754_4_bigendian) {
      return Format_IEEE_754_bigendian;
    }
    if (*(uchar (*) [4])float_magic == IEEE_754_4_littleendian) {
      return Format_IEEE_754_littleendian;
    }
  }
  else if (object_len == 8) {
    if (*(uchar (*) [8])float_magic == IEEE_754_8_bigendian) {
      return Format_IEEE_754_bigendian;
    }
    if (*(uchar (*) [8])float_magic == IEEE_754_8_littleendian) {
      return Format_IEEE_754_littleendian;
    }
    if (*(uchar (*) [8])float_magic == IEEE_754_8_mixedendian) {
      return Format_IEEE_754_mixedendian;
    }
  }
  else if (object_len == 0x10) {
    cVar19 = -(float_magic[2] == IEEE_754_16_bigendian[2]);
    cVar20 = -(float_magic[3] == IEEE_754_16_bigendian[3]);
    cVar21 = -(float_magic[4] == IEEE_754_16_bigendian[4]);
    cVar22 = -(float_magic[5] == IEEE_754_16_bigendian[5]);
    cVar23 = -(float_magic[6] == IEEE_754_16_bigendian[6]);
    cVar24 = -(float_magic[7] == IEEE_754_16_bigendian[7]);
    cVar25 = -(float_magic[8] == IEEE_754_16_bigendian[8]);
    cVar26 = -(float_magic[9] == IEEE_754_16_bigendian[9]);
    cVar27 = -(float_magic[10] == IEEE_754_16_bigendian[10]);
    cVar28 = -(float_magic[0xb] == IEEE_754_16_bigendian[0xb]);
    cVar29 = -(float_magic[0xc] == IEEE_754_16_bigendian[0xc]);
    cVar30 = -(float_magic[0xd] == IEEE_754_16_bigendian[0xd]);
    cVar31 = -(float_magic[0xe] == IEEE_754_16_bigendian[0xe]);
    bVar32 = -(float_magic[0xf] == IEEE_754_16_bigendian[0xf]);
    auVar1[1] = -(float_magic[1] == IEEE_754_16_bigendian[1]);
    auVar1[0] = -(*float_magic == IEEE_754_16_bigendian[0]);
    auVar1[2] = cVar19;
    auVar1[3] = cVar20;
    auVar1[4] = cVar21;
    auVar1[5] = cVar22;
    auVar1[6] = cVar23;
    auVar1[7] = cVar24;
    auVar1[8] = cVar25;
    auVar1[9] = cVar26;
    auVar1[10] = cVar27;
    auVar1[0xb] = cVar28;
    auVar1[0xc] = cVar29;
    auVar1[0xd] = cVar30;
    auVar1[0xe] = cVar31;
    auVar1[0xf] = bVar32;
    auVar2[1] = -(float_magic[1] == IEEE_754_16_bigendian[1]);
    auVar2[0] = -(*float_magic == IEEE_754_16_bigendian[0]);
    auVar2[2] = cVar19;
    auVar2[3] = cVar20;
    auVar2[4] = cVar21;
    auVar2[5] = cVar22;
    auVar2[6] = cVar23;
    auVar2[7] = cVar24;
    auVar2[8] = cVar25;
    auVar2[9] = cVar26;
    auVar2[10] = cVar27;
    auVar2[0xb] = cVar28;
    auVar2[0xc] = cVar29;
    auVar2[0xd] = cVar30;
    auVar2[0xe] = cVar31;
    auVar2[0xf] = bVar32;
    auVar16[1] = cVar20;
    auVar16[0] = cVar19;
    auVar16[2] = cVar21;
    auVar16[3] = cVar22;
    auVar16[4] = cVar23;
    auVar16[5] = cVar24;
    auVar16[6] = cVar25;
    auVar16[7] = cVar26;
    auVar16[8] = cVar27;
    auVar16[9] = cVar28;
    auVar16[10] = cVar29;
    auVar16[0xb] = cVar30;
    auVar16[0xc] = cVar31;
    auVar16[0xd] = bVar32;
    auVar13[1] = cVar21;
    auVar13[0] = cVar20;
    auVar13[2] = cVar22;
    auVar13[3] = cVar23;
    auVar13[4] = cVar24;
    auVar13[5] = cVar25;
    auVar13[6] = cVar26;
    auVar13[7] = cVar27;
    auVar13[8] = cVar28;
    auVar13[9] = cVar29;
    auVar13[10] = cVar30;
    auVar13[0xb] = cVar31;
    auVar13[0xc] = bVar32;
    auVar10[1] = cVar22;
    auVar10[0] = cVar21;
    auVar10[2] = cVar23;
    auVar10[3] = cVar24;
    auVar10[4] = cVar25;
    auVar10[5] = cVar26;
    auVar10[6] = cVar27;
    auVar10[7] = cVar28;
    auVar10[8] = cVar29;
    auVar10[9] = cVar30;
    auVar10[10] = cVar31;
    auVar10[0xb] = bVar32;
    auVar7[1] = cVar23;
    auVar7[0] = cVar22;
    auVar7[2] = cVar24;
    auVar7[3] = cVar25;
    auVar7[4] = cVar26;
    auVar7[5] = cVar27;
    auVar7[6] = cVar28;
    auVar7[7] = cVar29;
    auVar7[8] = cVar30;
    auVar7[9] = cVar31;
    auVar7[10] = bVar32;
    if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB141(auVar16 >> 7,0) & 1) << 2 |
                 (ushort)(SUB131(auVar13 >> 7,0) & 1) << 3 |
                 (ushort)(SUB121(auVar10 >> 7,0) & 1) << 4 |
                 (ushort)(SUB111(auVar7 >> 7,0) & 1) << 5 |
                 (ushort)((byte)(CONCAT19(bVar32,CONCAT18(cVar31,CONCAT17(cVar30,CONCAT16(cVar29,
                                                  CONCAT15(cVar28,CONCAT14(cVar27,CONCAT13(cVar26,
                                                  CONCAT12(cVar25,CONCAT11(cVar24,cVar23))))))))) >>
                                7) & 1) << 6 |
                 (ushort)((byte)(CONCAT18(bVar32,CONCAT17(cVar31,CONCAT16(cVar30,CONCAT15(cVar29,
                                                  CONCAT14(cVar28,CONCAT13(cVar27,CONCAT12(cVar26,
                                                  CONCAT11(cVar25,cVar24)))))))) >> 7) & 1) << 7 |
                (ushort)(bVar32 >> 7) << 0xf) == 0xffff) {
      return Format_IEEE_754_bigendian;
    }
    cVar19 = -(float_magic[2] == IEEE_754_16_littleendian[2]);
    cVar20 = -(float_magic[3] == IEEE_754_16_littleendian[3]);
    cVar21 = -(float_magic[4] == IEEE_754_16_littleendian[4]);
    cVar22 = -(float_magic[5] == IEEE_754_16_littleendian[5]);
    cVar23 = -(float_magic[6] == IEEE_754_16_littleendian[6]);
    cVar24 = -(float_magic[7] == IEEE_754_16_littleendian[7]);
    cVar25 = -(float_magic[8] == IEEE_754_16_littleendian[8]);
    cVar26 = -(float_magic[9] == IEEE_754_16_littleendian[9]);
    cVar27 = -(float_magic[10] == IEEE_754_16_littleendian[10]);
    cVar28 = -(float_magic[0xb] == IEEE_754_16_littleendian[0xb]);
    cVar29 = -(float_magic[0xc] == IEEE_754_16_littleendian[0xc]);
    cVar30 = -(float_magic[0xd] == IEEE_754_16_littleendian[0xd]);
    cVar31 = -(float_magic[0xe] == IEEE_754_16_littleendian[0xe]);
    bVar32 = -(float_magic[0xf] == IEEE_754_16_littleendian[0xf]);
    auVar3[1] = -(float_magic[1] == IEEE_754_16_littleendian[1]);
    auVar3[0] = -(*float_magic == IEEE_754_16_littleendian[0]);
    auVar3[2] = cVar19;
    auVar3[3] = cVar20;
    auVar3[4] = cVar21;
    auVar3[5] = cVar22;
    auVar3[6] = cVar23;
    auVar3[7] = cVar24;
    auVar3[8] = cVar25;
    auVar3[9] = cVar26;
    auVar3[10] = cVar27;
    auVar3[0xb] = cVar28;
    auVar3[0xc] = cVar29;
    auVar3[0xd] = cVar30;
    auVar3[0xe] = cVar31;
    auVar3[0xf] = bVar32;
    auVar4[1] = -(float_magic[1] == IEEE_754_16_littleendian[1]);
    auVar4[0] = -(*float_magic == IEEE_754_16_littleendian[0]);
    auVar4[2] = cVar19;
    auVar4[3] = cVar20;
    auVar4[4] = cVar21;
    auVar4[5] = cVar22;
    auVar4[6] = cVar23;
    auVar4[7] = cVar24;
    auVar4[8] = cVar25;
    auVar4[9] = cVar26;
    auVar4[10] = cVar27;
    auVar4[0xb] = cVar28;
    auVar4[0xc] = cVar29;
    auVar4[0xd] = cVar30;
    auVar4[0xe] = cVar31;
    auVar4[0xf] = bVar32;
    auVar17[1] = cVar20;
    auVar17[0] = cVar19;
    auVar17[2] = cVar21;
    auVar17[3] = cVar22;
    auVar17[4] = cVar23;
    auVar17[5] = cVar24;
    auVar17[6] = cVar25;
    auVar17[7] = cVar26;
    auVar17[8] = cVar27;
    auVar17[9] = cVar28;
    auVar17[10] = cVar29;
    auVar17[0xb] = cVar30;
    auVar17[0xc] = cVar31;
    auVar17[0xd] = bVar32;
    auVar14[1] = cVar21;
    auVar14[0] = cVar20;
    auVar14[2] = cVar22;
    auVar14[3] = cVar23;
    auVar14[4] = cVar24;
    auVar14[5] = cVar25;
    auVar14[6] = cVar26;
    auVar14[7] = cVar27;
    auVar14[8] = cVar28;
    auVar14[9] = cVar29;
    auVar14[10] = cVar30;
    auVar14[0xb] = cVar31;
    auVar14[0xc] = bVar32;
    auVar11[1] = cVar22;
    auVar11[0] = cVar21;
    auVar11[2] = cVar23;
    auVar11[3] = cVar24;
    auVar11[4] = cVar25;
    auVar11[5] = cVar26;
    auVar11[6] = cVar27;
    auVar11[7] = cVar28;
    auVar11[8] = cVar29;
    auVar11[9] = cVar30;
    auVar11[10] = cVar31;
    auVar11[0xb] = bVar32;
    auVar8[1] = cVar23;
    auVar8[0] = cVar22;
    auVar8[2] = cVar24;
    auVar8[3] = cVar25;
    auVar8[4] = cVar26;
    auVar8[5] = cVar27;
    auVar8[6] = cVar28;
    auVar8[7] = cVar29;
    auVar8[8] = cVar30;
    auVar8[9] = cVar31;
    auVar8[10] = bVar32;
    if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB141(auVar17 >> 7,0) & 1) << 2 |
                 (ushort)(SUB131(auVar14 >> 7,0) & 1) << 3 |
                 (ushort)(SUB121(auVar11 >> 7,0) & 1) << 4 |
                 (ushort)(SUB111(auVar8 >> 7,0) & 1) << 5 |
                 (ushort)((byte)(CONCAT19(bVar32,CONCAT18(cVar31,CONCAT17(cVar30,CONCAT16(cVar29,
                                                  CONCAT15(cVar28,CONCAT14(cVar27,CONCAT13(cVar26,
                                                  CONCAT12(cVar25,CONCAT11(cVar24,cVar23))))))))) >>
                                7) & 1) << 6 |
                 (ushort)((byte)(CONCAT18(bVar32,CONCAT17(cVar31,CONCAT16(cVar30,CONCAT15(cVar29,
                                                  CONCAT14(cVar28,CONCAT13(cVar27,CONCAT12(cVar26,
                                                  CONCAT11(cVar25,cVar24)))))))) >> 7) & 1) << 7 |
                (ushort)(bVar32 >> 7) << 0xf) == 0xffff) {
      return Format_IEEE_754_littleendian;
    }
    cVar19 = -(float_magic[2] == IEEE_754_16_mixedendian[2]);
    cVar20 = -(float_magic[3] == IEEE_754_16_mixedendian[3]);
    cVar21 = -(float_magic[4] == IEEE_754_16_mixedendian[4]);
    cVar22 = -(float_magic[5] == IEEE_754_16_mixedendian[5]);
    cVar23 = -(float_magic[6] == IEEE_754_16_mixedendian[6]);
    cVar24 = -(float_magic[7] == IEEE_754_16_mixedendian[7]);
    cVar25 = -(float_magic[8] == IEEE_754_16_mixedendian[8]);
    cVar26 = -(float_magic[9] == IEEE_754_16_mixedendian[9]);
    cVar27 = -(float_magic[10] == IEEE_754_16_mixedendian[10]);
    cVar28 = -(float_magic[0xb] == IEEE_754_16_mixedendian[0xb]);
    cVar29 = -(float_magic[0xc] == IEEE_754_16_mixedendian[0xc]);
    cVar30 = -(float_magic[0xd] == IEEE_754_16_mixedendian[0xd]);
    cVar31 = -(float_magic[0xe] == IEEE_754_16_mixedendian[0xe]);
    bVar32 = -(float_magic[0xf] == IEEE_754_16_mixedendian[0xf]);
    auVar5[1] = -(float_magic[1] == IEEE_754_16_mixedendian[1]);
    auVar5[0] = -(*float_magic == IEEE_754_16_mixedendian[0]);
    auVar5[2] = cVar19;
    auVar5[3] = cVar20;
    auVar5[4] = cVar21;
    auVar5[5] = cVar22;
    auVar5[6] = cVar23;
    auVar5[7] = cVar24;
    auVar5[8] = cVar25;
    auVar5[9] = cVar26;
    auVar5[10] = cVar27;
    auVar5[0xb] = cVar28;
    auVar5[0xc] = cVar29;
    auVar5[0xd] = cVar30;
    auVar5[0xe] = cVar31;
    auVar5[0xf] = bVar32;
    auVar6[1] = -(float_magic[1] == IEEE_754_16_mixedendian[1]);
    auVar6[0] = -(*float_magic == IEEE_754_16_mixedendian[0]);
    auVar6[2] = cVar19;
    auVar6[3] = cVar20;
    auVar6[4] = cVar21;
    auVar6[5] = cVar22;
    auVar6[6] = cVar23;
    auVar6[7] = cVar24;
    auVar6[8] = cVar25;
    auVar6[9] = cVar26;
    auVar6[10] = cVar27;
    auVar6[0xb] = cVar28;
    auVar6[0xc] = cVar29;
    auVar6[0xd] = cVar30;
    auVar6[0xe] = cVar31;
    auVar6[0xf] = bVar32;
    auVar18[1] = cVar20;
    auVar18[0] = cVar19;
    auVar18[2] = cVar21;
    auVar18[3] = cVar22;
    auVar18[4] = cVar23;
    auVar18[5] = cVar24;
    auVar18[6] = cVar25;
    auVar18[7] = cVar26;
    auVar18[8] = cVar27;
    auVar18[9] = cVar28;
    auVar18[10] = cVar29;
    auVar18[0xb] = cVar30;
    auVar18[0xc] = cVar31;
    auVar18[0xd] = bVar32;
    auVar15[1] = cVar21;
    auVar15[0] = cVar20;
    auVar15[2] = cVar22;
    auVar15[3] = cVar23;
    auVar15[4] = cVar24;
    auVar15[5] = cVar25;
    auVar15[6] = cVar26;
    auVar15[7] = cVar27;
    auVar15[8] = cVar28;
    auVar15[9] = cVar29;
    auVar15[10] = cVar30;
    auVar15[0xb] = cVar31;
    auVar15[0xc] = bVar32;
    auVar12[1] = cVar22;
    auVar12[0] = cVar21;
    auVar12[2] = cVar23;
    auVar12[3] = cVar24;
    auVar12[4] = cVar25;
    auVar12[5] = cVar26;
    auVar12[6] = cVar27;
    auVar12[7] = cVar28;
    auVar12[8] = cVar29;
    auVar12[9] = cVar30;
    auVar12[10] = cVar31;
    auVar12[0xb] = bVar32;
    auVar9[1] = cVar23;
    auVar9[0] = cVar22;
    auVar9[2] = cVar24;
    auVar9[3] = cVar25;
    auVar9[4] = cVar26;
    auVar9[5] = cVar27;
    auVar9[6] = cVar28;
    auVar9[7] = cVar29;
    auVar9[8] = cVar30;
    auVar9[9] = cVar31;
    auVar9[10] = bVar32;
    if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB141(auVar18 >> 7,0) & 1) << 2 |
                 (ushort)(SUB131(auVar15 >> 7,0) & 1) << 3 |
                 (ushort)(SUB121(auVar12 >> 7,0) & 1) << 4 |
                 (ushort)(SUB111(auVar9 >> 7,0) & 1) << 5 |
                 (ushort)((byte)(CONCAT19(bVar32,CONCAT18(cVar31,CONCAT17(cVar30,CONCAT16(cVar29,
                                                  CONCAT15(cVar28,CONCAT14(cVar27,CONCAT13(cVar26,
                                                  CONCAT12(cVar25,CONCAT11(cVar24,cVar23))))))))) >>
                                7) & 1) << 6 |
                 (ushort)((byte)(CONCAT18(bVar32,CONCAT17(cVar31,CONCAT16(cVar30,CONCAT15(cVar29,
                                                  CONCAT14(cVar28,CONCAT13(cVar27,CONCAT12(cVar26,
                                                  CONCAT11(cVar25,cVar24)))))))) >> 7) & 1) << 7 |
                (ushort)(bVar32 >> 7) << 0xf) == 0xffff) {
      return Format_IEEE_754_mixedendian;
    }
  }
  return Format_Unknown;
}

Assistant:

static FMfloat_format
infer_float_format(char *float_magic, int object_len)
{
    switch (object_len) {
    case 4:
	if (memcmp(float_magic, &IEEE_754_4_bigendian[0], 4) == 0) {
	    return Format_IEEE_754_bigendian;
	} else if (memcmp(float_magic, &IEEE_754_4_littleendian[0], 4) == 0) {
	    return Format_IEEE_754_littleendian;
	}
	break;
    case 8:
	if (memcmp(float_magic, &IEEE_754_8_bigendian[0], 8) == 0) {
	    return Format_IEEE_754_bigendian;
	} else if (memcmp(float_magic, &IEEE_754_8_littleendian[0], 8) == 0) {
	    return Format_IEEE_754_littleendian;
	} else if (memcmp(float_magic, &IEEE_754_8_mixedendian[0], 8) == 0) {
	    return Format_IEEE_754_mixedendian;
	}
	break;
    case 16:
	if (memcmp(float_magic, &IEEE_754_16_bigendian[0], 16) == 0) {
	    return Format_IEEE_754_bigendian;
	} else if (memcmp(float_magic, &IEEE_754_16_littleendian[0], 16) ==0){
	    return Format_IEEE_754_littleendian;
	} else if (memcmp(float_magic, &IEEE_754_16_mixedendian[0], 16) == 0){
	    return Format_IEEE_754_mixedendian;
	}
	break;
    }
    return Format_Unknown;
}